

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O2

ARKodeSPRKTable arkodeSymplecticSuzukiUmeno816(void)

{
  double *pdVar1;
  sunrealtype *psVar2;
  double dVar3;
  ARKodeSPRKTable pAVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  pAVar4 = ARKodeSPRKTable_Alloc(0x10);
  if (pAVar4 != (ARKodeSPRKTable)0x0) {
    pAVar4->q = 8;
    pAVar4->stages = 0x10;
    pdVar1 = pAVar4->a;
    *pdVar1 = 0.741670364350613;
    pdVar1[1] = -0.4091008258000316;
    pdVar1[2] = 0.1907547102962384;
    pdVar1[3] = -0.5738624711160822;
    pdVar1[4] = 0.2990641813036559;
    pdVar1[5] = 0.33462491824529816;
    pdVar1[6] = 0.3152930923967666;
    pdVar1[7] = -0.7968879393529164;
    pdVar1[8] = 0.3152930923967666;
    pdVar1[9] = 0.33462491824529816;
    pdVar1[10] = 0.2990641813036559;
    pdVar1[0xb] = -0.5738624711160822;
    pdVar1[0xc] = 0.1907547102962384;
    pdVar1[0xd] = -0.4091008258000316;
    pdVar1[0xe] = 0.741670364350613;
    pdVar1[0xf] = 0.0;
    psVar2 = pAVar4->ahat;
    *psVar2 = 0.3708351821753065;
    dVar3 = (*pdVar1 + pdVar1[1]) * 0.5;
    psVar2[1] = dVar3;
    dVar5 = (pdVar1[1] + pdVar1[2]) * 0.5;
    psVar2[2] = dVar5;
    dVar6 = (pdVar1[2] + pdVar1[3]) * 0.5;
    psVar2[3] = dVar6;
    dVar7 = (pdVar1[3] + pdVar1[4]) * 0.5;
    psVar2[4] = dVar7;
    dVar8 = (pdVar1[4] + pdVar1[5]) * 0.5;
    psVar2[5] = dVar8;
    dVar9 = (pdVar1[5] + pdVar1[6]) * 0.5;
    psVar2[6] = dVar9;
    dVar10 = (pdVar1[6] + pdVar1[7]) * 0.5;
    psVar2[7] = dVar10;
    psVar2[8] = dVar10;
    psVar2[9] = dVar9;
    psVar2[10] = dVar8;
    psVar2[0xb] = dVar7;
    psVar2[0xc] = dVar6;
    psVar2[0xd] = dVar5;
    psVar2[0xe] = dVar3;
    psVar2[0xf] = 0.3708351821753065;
  }
  return pAVar4;
}

Assistant:

static ARKodeSPRKTable arkodeSymplecticSuzukiUmeno816(void)
{
  ARKodeSPRKTable sprk_table = ARKodeSPRKTable_Alloc(16);
  if (!sprk_table) { return NULL; }
  sprk_table->q       = 8;
  sprk_table->stages  = 16;
  sprk_table->a[0]    = SUN_RCONST(0.7416703643506129534482278017838063156035);
  sprk_table->a[1]    = -SUN_RCONST(0.4091008258000315939973000958935634173099);
  sprk_table->a[2]    = SUN_RCONST(0.1907547102962383799538762564503716627355);
  sprk_table->a[3]    = -SUN_RCONST(0.5738624711160822666563877266355357421595);
  sprk_table->a[4]    = SUN_RCONST(0.2990641813036559238444635406886029882258);
  sprk_table->a[5]    = SUN_RCONST(0.3346249182452981837849579798821822886337);
  sprk_table->a[6]    = SUN_RCONST(0.3152930923967665966320566638110024309941);
  sprk_table->a[7]    = -SUN_RCONST(0.7968879393529163540197888401737330534463);
  sprk_table->a[8]    = sprk_table->a[6];
  sprk_table->a[9]    = sprk_table->a[5];
  sprk_table->a[10]   = sprk_table->a[4];
  sprk_table->a[11]   = sprk_table->a[3];
  sprk_table->a[12]   = sprk_table->a[2];
  sprk_table->a[13]   = sprk_table->a[1];
  sprk_table->a[14]   = sprk_table->a[0];
  sprk_table->a[15]   = SUN_RCONST(0.0);
  sprk_table->ahat[0] = sprk_table->a[0] / SUN_RCONST(2.0);
  sprk_table->ahat[1] = (sprk_table->a[0] + sprk_table->a[1]) / SUN_RCONST(2.0);
  sprk_table->ahat[2] = (sprk_table->a[1] + sprk_table->a[2]) / SUN_RCONST(2.0);
  sprk_table->ahat[3] = (sprk_table->a[2] + sprk_table->a[3]) / SUN_RCONST(2.0);
  sprk_table->ahat[4] = (sprk_table->a[3] + sprk_table->a[4]) / SUN_RCONST(2.0);
  sprk_table->ahat[5] = (sprk_table->a[4] + sprk_table->a[5]) / SUN_RCONST(2.0);
  sprk_table->ahat[6] = (sprk_table->a[5] + sprk_table->a[6]) / SUN_RCONST(2.0);
  sprk_table->ahat[7] = (sprk_table->a[6] + sprk_table->a[7]) / SUN_RCONST(2.0);
  sprk_table->ahat[8] = sprk_table->ahat[7];
  sprk_table->ahat[9] = sprk_table->ahat[6];
  sprk_table->ahat[10] = sprk_table->ahat[5];
  sprk_table->ahat[11] = sprk_table->ahat[4];
  sprk_table->ahat[12] = sprk_table->ahat[3];
  sprk_table->ahat[13] = sprk_table->ahat[2];
  sprk_table->ahat[14] = sprk_table->ahat[1];
  sprk_table->ahat[15] = sprk_table->ahat[0];
  return sprk_table;
}